

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

void __thiscall TPZString::Append(TPZString *this,char *TailIncrement)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *in_RSI;
  long *in_RDI;
  size_t len;
  int OldLength;
  TPZString *in_stack_ffffffffffffffc8;
  
  sVar3 = Length(in_stack_ffffffffffffffc8);
  iVar2 = (int)sVar3;
  sVar4 = strlen(in_RSI);
  if ((ulong)in_RDI[2] < (long)iVar2 + sVar4 + 1) {
    (**(code **)(*in_RDI + 0x18))(in_RDI,(long)iVar2 + sVar4 + 1);
  }
  strncpy((char *)(in_RDI[1] + (long)iVar2),in_RSI,in_RDI[2] - (long)iVar2);
  lVar1 = in_RDI[1];
  sVar3 = Length(in_stack_ffffffffffffffc8);
  *(undefined1 *)(lVar1 + sVar3) = 0;
  return;
}

Assistant:

void TPZString::Append(const char * TailIncrement)
{
	int OldLength = Length();
	size_t len = strlen(TailIncrement);
	
	if (fNElements < OldLength + len + 1) Resize(OldLength + len + 1); // the 1 stands for the null char
	
	strncpy(fStore + OldLength, TailIncrement,fNElements-OldLength);
	fStore[Length()] = '\0'; // just to ensure the string contains a null character
}